

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_flee(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  AFFECT_DATA *pAVar6;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var7;
  int door;
  EXIT_DATA *pexit;
  bool pounced;
  int dir;
  int chance;
  int attempt;
  char arg [4608];
  CHAR_DATA *panther;
  CHAR_DATA *victim;
  ROOM_INDEX_DATA *now_in;
  ROOM_INDEX_DATA *was_in;
  CHAR_DATA *in_stack_ffffffffffffed98;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffeda8;
  int in_stack_ffffffffffffedac;
  CHAR_DATA *in_stack_ffffffffffffedb0;
  uint3 in_stack_ffffffffffffedb8;
  uint uVar8;
  undefined4 in_stack_ffffffffffffedbc;
  int iVar9;
  undefined4 in_stack_ffffffffffffedc4;
  char in_stack_ffffffffffffedc8;
  undefined7 in_stack_ffffffffffffedc9;
  char *in_stack_ffffffffffffee28;
  CHAR_DATA *in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee74;
  undefined1 in_stack_ffffffffffffee7b;
  int in_stack_ffffffffffffee7c;
  CHAR_DATA *in_stack_ffffffffffffee80;
  int in_stack_ffffffffffffee9c;
  CHAR_DATA *in_stack_ffffffffffffeea0;
  CHAR_DATA *local_30;
  CHAR_DATA *victim_00;
  CHAR_DATA *ch_01;
  
  uVar8 = (uint)in_stack_ffffffffffffedb8;
  victim_00 = in_RDI->fighting;
  if (victim_00 == (CHAR_DATA *)0x0) {
    if (in_RDI->position == 7) {
      in_RDI->position = 8;
    }
    send_to_char((char *)in_stack_ffffffffffffedb0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
  }
  else {
    pAVar6 = check_bind((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                        in_stack_ffffffffffffeda0);
    if (pAVar6 == (AFFECT_DATA *)0x0) {
      bVar2 = check_entwine(in_RDI,1);
      if ((bVar2) || (bVar2 = check_entwine(in_RDI,2), bVar2)) {
        act((char *)in_stack_ffffffffffffedb0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
            in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,0);
      }
      else {
        bVar2 = check_entwine(in_RDI,0);
        if (bVar2) {
          do_uncoil(in_stack_ffffffffffffee30,in_stack_ffffffffffffee28);
        }
        bVar2 = is_affected(in_RDI,(int)gsn_web);
        if ((bVar2) && (iVar3 = number_percent(), 0x3c < iVar3)) {
          act((char *)in_stack_ffffffffffffedb0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
              in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,0);
          act((char *)in_stack_ffffffffffffedb0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
              in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,0);
          check_parting_blow((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,uVar8),
                             in_stack_ffffffffffffedb0);
          WAIT_STATE(in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac);
        }
        else {
          one_argument(in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98);
          iVar3 = get_skill(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c);
          if (0x5a < iVar3) {
            iVar3 = 0x5a;
          }
          if (in_stack_ffffffffffffedc8 == '\0') {
            iVar9 = 10;
          }
          else {
            bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,in_stack_ffffffffffffedc8)
                               ,(char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
            if (bVar2) {
              bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,
                                                  in_stack_ffffffffffffedc8),
                                 (char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
              if (bVar2) {
                bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,
                                                    in_stack_ffffffffffffedc8),
                                   (char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
                if (bVar2) {
                  bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,
                                                      in_stack_ffffffffffffedc8),
                                     (char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
                  if (bVar2) {
                    bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,
                                                        in_stack_ffffffffffffedc8),
                                       (char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
                    if (bVar2) {
                      bVar2 = str_prefix((char *)CONCAT71(in_stack_ffffffffffffedc9,
                                                          in_stack_ffffffffffffedc8),
                                         (char *)CONCAT44(in_stack_ffffffffffffedc4,iVar3));
                      if (bVar2) {
                        iVar9 = 10;
                      }
                      else {
                        iVar9 = 5;
                      }
                    }
                    else {
                      iVar9 = 4;
                    }
                  }
                  else {
                    iVar9 = 3;
                  }
                }
                else {
                  iVar9 = 2;
                }
              }
              else {
                iVar9 = 1;
              }
            }
            else {
              iVar9 = 0;
            }
          }
          pCVar1 = (CHAR_DATA *)in_RDI->in_room;
          for (local_30 = in_RDI->in_room->people;
              (local_30 != (CHAR_DATA *)0x0 &&
              ((((bVar2 = is_npc(in_stack_ffffffffffffed98), bVar2 ||
                 (bVar2 = is_affected(local_30,(int)gsn_rage), !bVar2)) ||
                (local_30->pcdata->tribe != 10)) || (local_30->fighting != in_RDI))));
              local_30 = local_30->next_in_room) {
          }
          if (((local_30 != (CHAR_DATA *)0x0) && (bVar2 = is_npc(in_stack_ffffffffffffed98), bVar2))
             || ((local_30 != (CHAR_DATA *)0x0 && (iVar4 = number_percent(), 0x1e < iVar4)))) {
            uVar8 = CONCAT13(1,(int3)uVar8);
          }
          for (iVar4 = 0; iVar4 < 6; iVar4 = iVar4 + 1) {
            if ((iVar9 == 10) ||
               (in_stack_ffffffffffffedac = iVar9, iVar5 = number_percent(),
               iVar9 = in_stack_ffffffffffffedac, iVar3 < iVar5)) {
              in_stack_ffffffffffffedac = number_door();
            }
            in_stack_ffffffffffffedb0 = (&pCVar1->last_fought)[in_stack_ffffffffffffedac];
            if ((in_stack_ffffffffffffedb0 != (CHAR_DATA *)0x0) &&
               (in_stack_ffffffffffffedb0->next != (CHAR_DATA *)0x0)) {
              ch_00 = in_stack_ffffffffffffedb0->next_in_room;
              _Var7 = std::pow<int,int>(0,0x5e3b22);
              if ((((ulong)ch_00 & (long)_Var7) == 0) ||
                 (bVar2 = is_affected_by((CHAR_DATA *)
                                         CONCAT44(in_stack_ffffffffffffedac,
                                                  in_stack_ffffffffffffeda8),
                                         (int)((ulong)ch_00 >> 0x20)), bVar2)) {
                bVar2 = is_npc(in_stack_ffffffffffffed98);
                if (!bVar2) {
LAB_005e3b96:
                  bVar2 = outflank_me((CHAR_DATA *)
                                      CONCAT71(in_stack_ffffffffffffedc9,in_stack_ffffffffffffedc8),
                                      iVar4);
                  if (bVar2) {
                    return;
                  }
                  bVar2 = check_parting_blow((CHAR_DATA *)CONCAT44(iVar9,uVar8),
                                             in_stack_ffffffffffffedb0);
                  if (bVar2) {
                    return;
                  }
                  bVar2 = is_carrying_type(in_RDI,0x16);
                  if (((!bVar2) &&
                      (((in_RDI->in_room->exit[in_stack_ffffffffffffedac]->u1).to_room)->sector_type
                       == 6)) &&
                     (bVar2 = is_affected_by((CHAR_DATA *)
                                             CONCAT44(in_stack_ffffffffffffedac,
                                                      in_stack_ffffffffffffeda8),
                                             (int)((ulong)ch_00 >> 0x20)), !bVar2)) {
                    char_data::Profs(in_RDI);
                    bVar2 = CProficiencies::HasProf
                                      ((CProficiencies *)
                                       CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8)
                                       ,(int)((ulong)ch_00 >> 0x20));
                    if (!bVar2) {
                      send_to_char((char *)in_stack_ffffffffffffedb0,
                                   (CHAR_DATA *)
                                   CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
                      return;
                    }
                  }
                  stop_fighting(ch_00,SUB81((ulong)in_stack_ffffffffffffed98 >> 0x38,0));
                  move_char((CHAR_DATA *)arg._1168_8_,arg._1164_4_,(bool)arg[0x48b],(bool)arg[0x48a]
                           );
                  ch_01 = (CHAR_DATA *)in_RDI->in_room;
                  if (ch_01 != pCVar1) {
                    in_RDI->last_fought = (CHAR_DATA *)0x0;
                    in_RDI->batter = 0;
                    in_RDI->in_room = (ROOM_INDEX_DATA *)pCVar1;
                    act((char *)in_stack_ffffffffffffedb0,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                        ch_00,in_stack_ffffffffffffed98,0);
                    bVar2 = is_npc(in_stack_ffffffffffffed98);
                    if (((!bVar2) &&
                        (send_to_char((char *)in_stack_ffffffffffffedb0,
                                      (CHAR_DATA *)
                                      CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8))
                        , iVar9 != 10)) &&
                       (iVar3 = get_skill(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c),
                       2 < iVar3)) {
                      check_improve(in_stack_ffffffffffffee80,in_stack_ffffffffffffee7c,
                                    (bool)in_stack_ffffffffffffee7b,in_stack_ffffffffffffee74);
                    }
                    if (((local_30 != (CHAR_DATA *)0x0) && ((uVar8 & 0x1000000) != 0)) &&
                       (bVar2 = is_npc(in_stack_ffffffffffffed98), !bVar2)) {
                      act((char *)in_stack_ffffffffffffedb0,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8)
                          ,ch_00,in_stack_ffffffffffffed98,0);
                      act((char *)in_stack_ffffffffffffedb0,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8)
                          ,ch_00,in_stack_ffffffffffffed98,0);
                    }
                    in_RDI->in_room = (ROOM_INDEX_DATA *)ch_01;
                    if (local_30 == (CHAR_DATA *)0x0) {
                      return;
                    }
                    if ((uVar8 & 0x1000000) == 0) {
                      return;
                    }
                    move_char((CHAR_DATA *)arg._1168_8_,arg._1164_4_,(bool)arg[0x48b],
                              (bool)arg[0x48a]);
                    if (local_30->in_room != in_RDI->in_room) {
                      return;
                    }
                    bVar2 = is_npc(in_stack_ffffffffffffed98);
                    if (bVar2) {
                      act((char *)in_stack_ffffffffffffedb0,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8)
                          ,ch_00,in_stack_ffffffffffffed98,0);
                      iVar3 = (int)((ulong)ch_00 >> 0x20);
                    }
                    else {
                      act((char *)in_stack_ffffffffffffedb0,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8)
                          ,ch_00,in_stack_ffffffffffffed98,0);
                      iVar3 = (int)((ulong)ch_00 >> 0x20);
                    }
                    send_to_char((char *)in_stack_ffffffffffffedb0,
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
                    WAIT_STATE(in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac);
                    one_hit(in_stack_ffffffffffffedb0,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3);
                    return;
                  }
                  set_fighting(ch_01,victim_00);
                  set_fighting(ch_01,victim_00);
                  return;
                }
                in_stack_ffffffffffffed98 = *(CHAR_DATA **)&in_stack_ffffffffffffedb0->next->lines;
                _Var7 = std::pow<int,int>(0,0x5e3b7f);
                if (((ulong)in_stack_ffffffffffffed98 & (long)_Var7) == 0) goto LAB_005e3b96;
              }
            }
          }
          send_to_char((char *)in_stack_ffffffffffffedb0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
        }
      }
    }
    else {
      act((char *)in_stack_ffffffffffffedb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
          in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,0);
      act((char *)in_stack_ffffffffffffedb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
          in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98,0);
      WAIT_STATE(in_stack_ffffffffffffedb0,in_stack_ffffffffffffedac);
      check_parting_blow((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedbc,uVar8),
                         in_stack_ffffffffffffedb0);
    }
  }
  return;
}

Assistant:

void do_flee(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *was_in;
	ROOM_INDEX_DATA *now_in;
	CHAR_DATA *victim, *panther;
	char arg[MAX_INPUT_LENGTH];
	int attempt, chance, dir;
	bool pounced = false;

	victim = ch->fighting;

	if (victim == nullptr)
	{
		if (ch->position == POS_FIGHTING)
			ch->position = POS_STANDING;

		send_to_char("You aren't fighting anyone.\n\r", ch);
		return;
	}

	if (check_bind(ch, "legs"))
	{
		act("$n attempts to flee but $s bindings cause $m to trip up and fall!", ch, 0, 0, TO_ROOM);
		act("You attempt to flee but your bindings cause you to trip up and fall!", ch, 0, 0, TO_CHAR);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		check_parting_blow(ch, victim);
		return;
	}

	if (check_entwine(ch, 1) || check_entwine(ch, 2))
	{
		act("You are too tightly entwined to escape!", ch, nullptr, nullptr, TO_CHAR);
		return;
	}

	if (check_entwine(ch, 0))
		do_uncoil(ch, "");

	if (is_affected(ch, gsn_web) && number_percent() > 60)
	{
		act("$n tries to flee, but the webs $e's entangled in cause $m to trip up and fall!", ch, 0, 0, TO_ROOM);
		act("You try to flee, but the webs you are entangled in cause you to trip up and fall!", ch, 0, 0, TO_CHAR);
		check_parting_blow(ch, victim);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		return;
	}

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_escape);

	if (chance > 90)
		chance = 90;

	dir = 10;

	if (arg[0] == '\0')
		dir = 10;
	else if (!str_prefix(arg, "north"))
		dir = 0;
	else if (!str_prefix(arg, "east"))
		dir = 1;
	else if (!str_prefix(arg, "south"))
		dir = 2;
	else if (!str_prefix(arg, "west"))
		dir = 3;
	else if (!str_prefix(arg, "up"))
		dir = 4;
	else if (!str_prefix(arg, "down"))
		dir = 5;
	else
		dir = 10;

	was_in = ch->in_room;

	for (panther = ch->in_room->people; panther; panther = panther->next_in_room)
	{
		if (!is_npc(panther)
			&& is_affected(panther, gsn_rage)
			&& panther->pcdata->tribe == TRIBE_PANTHER
			&& panther->fighting == ch)
		{
			break;
		}
	}

	if ((panther && is_npc(panther)) || (panther && number_percent() > 30))
		pounced = true;

	for (attempt = 0; attempt < 6; attempt++)
	{
		EXIT_DATA *pexit;
		int door;

		if (dir == 10 || number_percent() > chance)
			door = number_door();
		else
			door = dir;

		pexit = was_in->exit[door];

		if (pexit == 0
			|| pexit->u1.to_room == nullptr
			|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
			|| (is_npc(ch) && IS_SET(pexit->u1.to_room->room_flags, ROOM_NO_MOB)))
		{
			continue;
		}

		if (outflank_me(ch, door))
			return;

		if (check_parting_blow(ch, victim)) // true = died to parting blow
			return;

		if (!is_carrying_type(ch, ITEM_BOAT)
			&& ch->in_room->exit[door]->u1.to_room->sector_type == SECT_WATER
			&& !is_affected_by(ch, AFF_FLYING)
			&& !ch->Profs()->HasProf(psn_swimming))
		{
			send_to_char("You need a boat to go there.\n\r", ch);
			return;
		}

		stop_fighting(ch, true);

		move_char(ch, door, false, true);

		now_in = ch->in_room;

		if (now_in == was_in)
		{
			set_fighting(victim, ch);
			set_fighting(ch, victim); // to stop people from walking away
			return;
		}

		ch->last_fought = nullptr;
		ch->batter = 0;
		ch->in_room = was_in;

		act("$n has fled!", ch, nullptr, nullptr, TO_ROOM);

		if (!is_npc(ch))
		{
			send_to_char("You flee from combat!\n\r", ch);

			if (dir != 10 && get_skill(ch, gsn_escape) > 2)
				check_improve(ch, gsn_escape, 2, true);
		}

		if (panther && pounced && !is_npc(panther))
		{
			act("$n unleashes a loud roar and leaps after $N!", panther, 0, ch, TO_NOTVICT);
			act("Sensing $n's fear as $e turns to flee, you roar and leap after $m!", ch, 0, panther, TO_VICT);
		}

		/*
		if(panther && is_npc(panther))
		{
			act("$n flees the room, $N still stuck to $s face!",ch,0,panther,TO_NOTVICT);
		}
		*/

		ch->in_room = now_in;

		if (panther && pounced)
		{
			move_char(panther, door, false, true);

			if (panther->in_room != ch->in_room)
				return;

			if (!is_npc(panther))
				act("$n chases $N into the room, leaping upon $M!", panther, 0, ch, TO_NOTVICT);
			else
				act("$n runs into the room screaming, $N latched to $s face!", ch, 0, panther, TO_NOTVICT);

			send_to_char("You flee, but the worm is still attached to your face!\n\r", ch);
			WAIT_STATE(ch, PULSE_VIOLENCE);
			one_hit(panther, ch, TYPE_UNDEFINED);
		}

		return;
	}

	send_to_char("PANIC! You couldn't escape!\n\r", ch);
}